

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen11ResourceULT.cpp
# Opt level: O3

void __thiscall
CTestGen11Resource_TestPlanar2D_NV12_MediaCompressed_Test::TestBody
          (CTestGen11Resource_TestPlanar2D_NV12_MediaCompressed_Test *this)

{
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *expected;
  bool bVar1;
  GMM_RESOURCE_INFO *ResourceInfo;
  char *pcVar2;
  uint uVar3;
  ulong ExpectedValue;
  int iVar4;
  undefined4 local_e0;
  undefined4 local_dc;
  undefined8 local_d8;
  ulong local_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  uint local_5c;
  uint local_58;
  uint32_t MediaStateOffset;
  internal local_50 [4];
  uint32_t Size;
  AssertionResult gtest_ar;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  
  uStack_70 = 0;
  local_b8 = 0;
  uStack_a0 = 0;
  local_88 = 0;
  uStack_80 = 0;
  local_98 = 0;
  uStack_90 = 0;
  local_c8 = 0;
  uStack_c0 = 0;
  local_68 = 0;
  local_e0 = 2;
  local_78 = 0x100000000;
  local_d8 = 0x2400010000;
  uStack_b0 = 0x2048;
  local_a8 = 0x100000274;
  local_d0 = (ulong)(((uint)(CommonULT::pGfxAdapterInfo->SkuTable).field_0 & 0x40) == 0) << 0x2b |
             0x1000000000;
  local_dc = 0x15d;
  ResourceInfo = (GMM_RESOURCE_INFO *)
                 (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0xe8))
                           (CommonULT::pGmmULTClientContext,&local_e0);
  uVar3 = (int)uStack_b0 + 0x7f;
  local_58 = uVar3 & 0xffffff80;
  iVar4 = (((uint)local_a8 >> 1) + 0x1f & 0xffffffe0) + ((uint)local_a8 + 0x1f & 0xffffffe0);
  MediaStateOffset = iVar4 * local_58;
  ExpectedValue = (ulong)MediaStateOffset;
  CTestResource::VerifyResourcePitch<true>((CTestResource *)this,ResourceInfo,local_58);
  CTestResource::VerifyResourcePitchInTiles<true>((CTestResource *)this,ResourceInfo,uVar3 >> 7);
  CTestResource::VerifyResourceSize<true>((CTestResource *)this,ResourceInfo,ExpectedValue);
  expected = &gtest_ar.message_;
  gtest_ar.message_.ptr_._0_4_ = 0;
  local_38.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       (**(code **)(*(long *)ResourceInfo + 0x210))(ResourceInfo,1);
  testing::internal::CmpHelperEQ<int,unsigned_long>
            (local_50,"0","ResourceInfo->GetPlanarXOffset(GMM_PLANE_Y)",(int *)expected,
             (unsigned_long *)&local_38);
  if (local_50[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_38);
    if (gtest_ar._0_8_ == 0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen11ResourceULT.cpp"
               ,0x6a,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar.message_,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
    if (local_38.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_38.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_38.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  gtest_ar.message_.ptr_._0_4_ = 0;
  local_38.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       (**(code **)(*(long *)ResourceInfo + 0x218))(ResourceInfo,1);
  testing::internal::CmpHelperEQ<int,unsigned_long>
            (local_50,"0","ResourceInfo->GetPlanarYOffset(GMM_PLANE_Y)",(int *)expected,
             (unsigned_long *)&local_38);
  if (local_50[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_38);
    if (gtest_ar._0_8_ == 0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen11ResourceULT.cpp"
               ,0x6b,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar.message_,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
    if (local_38.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_38.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_38.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  gtest_ar.message_.ptr_._0_4_ = 0;
  local_38.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       (**(code **)(*(long *)ResourceInfo + 0x210))(ResourceInfo,2);
  testing::internal::CmpHelperEQ<int,unsigned_long>
            (local_50,"0","ResourceInfo->GetPlanarXOffset(GMM_PLANE_U)",(int *)expected,
             (unsigned_long *)&local_38);
  if (local_50[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_38);
    if (gtest_ar._0_8_ == 0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen11ResourceULT.cpp"
               ,0x6e,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar.message_,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
    if (local_38.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_38.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_38.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  gtest_ar.message_.ptr_._0_4_ = (uint)local_a8 + 0x1f & 0xffffffe0;
  local_38.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       (**(code **)(*(long *)ResourceInfo + 0x218))(ResourceInfo,2);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            (local_50,
             "(((gmmParams.BaseHeight) + ((TileSize[1]) - 1)) - (((gmmParams.BaseHeight) + ((TileSize[1]) - 1)) & ((TileSize[1]) - 1)))"
             ,"ResourceInfo->GetPlanarYOffset(GMM_PLANE_U)",(uint *)expected,
             (unsigned_long *)&local_38);
  if (local_50[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_38);
    if (gtest_ar._0_8_ == 0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen11ResourceULT.cpp"
               ,0x6f,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar.message_,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
    if (local_38.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_38.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_38.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  gtest_ar.message_.ptr_._0_4_ = 0;
  local_38.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       (**(code **)(*(long *)ResourceInfo + 0x210))(ResourceInfo,3);
  testing::internal::CmpHelperEQ<int,unsigned_long>
            (local_50,"0","ResourceInfo->GetPlanarXOffset(GMM_PLANE_V)",(int *)expected,
             (unsigned_long *)&local_38);
  if (local_50[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_38);
    if (gtest_ar._0_8_ == 0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen11ResourceULT.cpp"
               ,0x70,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar.message_,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
    if (local_38.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_38.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_38.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  gtest_ar.message_.ptr_._0_4_ = (uint)local_a8 + 0x1f & 0xffffffe0;
  local_38.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       (**(code **)(*(long *)ResourceInfo + 0x218))(ResourceInfo,2);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            (local_50,
             "(((gmmParams.BaseHeight) + ((TileSize[1]) - 1)) - (((gmmParams.BaseHeight) + ((TileSize[1]) - 1)) & ((TileSize[1]) - 1)))"
             ,"ResourceInfo->GetPlanarYOffset(GMM_PLANE_U)",(uint *)expected,
             (unsigned_long *)&local_38);
  if (local_50[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_38);
    if (gtest_ar._0_8_ == 0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen11ResourceULT.cpp"
               ,0x72,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar.message_,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
    if (local_38.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_38.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_38.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  gtest_ar.message_.ptr_._0_4_ = (uint)local_a8 + 0x1f & 0xffffffe0;
  local_38.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       (**(code **)(*(long *)ResourceInfo + 0x218))(ResourceInfo,3);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            (local_50,
             "(((gmmParams.BaseHeight) + ((TileSize[1]) - 1)) - (((gmmParams.BaseHeight) + ((TileSize[1]) - 1)) & ((TileSize[1]) - 1)))"
             ,"ResourceInfo->GetPlanarYOffset(GMM_PLANE_V)",(uint *)expected,
             (unsigned_long *)&local_38);
  if (local_50[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_38);
    if (gtest_ar._0_8_ == 0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen11ResourceULT.cpp"
               ,0x73,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar.message_,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
    if (local_38.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_38.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_38.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_38.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       (**(code **)(*(long *)ResourceInfo + 0x2a0))(ResourceInfo,1);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            (local_50,"Size","ResourceInfo->GetUnifiedAuxSurfaceOffset(GMM_AUX_CCS)",
             &MediaStateOffset,(unsigned_long *)&local_38);
  if (local_50[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_38);
    if (gtest_ar._0_8_ == 0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen11ResourceULT.cpp"
               ,0x76,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar.message_,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
    if (local_38.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_38.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_38.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_38.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       (**(code **)(*(long *)ResourceInfo + 0x2a0))(ResourceInfo,2);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            (local_50,"Size","ResourceInfo->GetUnifiedAuxSurfaceOffset(GMM_AUX_Y_CCS)",
             &MediaStateOffset,(unsigned_long *)&local_38);
  if (local_50[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_38);
    if (gtest_ar._0_8_ == 0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen11ResourceULT.cpp"
               ,0x77,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar.message_,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
    if (local_38.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_38.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_38.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  uVar3 = (((uint)local_a8 + 0x1f & 0xffffffe0) * local_58 >> 10) + 0xfff & 0x7ff000;
  gtest_ar.message_.ptr_._0_4_ = MediaStateOffset + uVar3;
  local_38.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       (**(code **)(*(long *)ResourceInfo + 0x2a0))(ResourceInfo,3);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            (local_50,"Size + YCcsSize","ResourceInfo->GetUnifiedAuxSurfaceOffset(GMM_AUX_UV_CCS)",
             (uint *)&gtest_ar.message_,(unsigned_long *)&local_38);
  if (local_50[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_38);
    if (gtest_ar._0_8_ == 0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen11ResourceULT.cpp"
               ,0x7b,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar.message_,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
    if (local_38.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_38.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_38.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_5c = uVar3 + MediaStateOffset +
             (((iVar4 - ((uint)local_a8 + 0x1f & 0xffffffe0)) * local_58 >> 10) + 0xfff & 0x7ff000);
  local_38.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       (**(code **)(*(long *)ResourceInfo + 0x2a0))(ResourceInfo,5);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            (local_50,"MediaStateOffset",
             "ResourceInfo->GetUnifiedAuxSurfaceOffset(GMM_AUX_COMP_STATE)",&local_5c,
             (unsigned_long *)&local_38);
  if (local_50[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_38);
    if (gtest_ar._0_8_ == 0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen11ResourceULT.cpp"
               ,0x7f,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar.message_,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
    if (local_38.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_38.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_38.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0x100))
            (CommonULT::pGmmULTClientContext,ResourceInfo);
  return;
}

Assistant:

TEST_F(CTestGen11Resource, TestPlanar2D_NV12_MediaCompressed)
{
    /* Test planar surface with hybrid UV planes where UV plane is half the size
    of Y and U/V data is packed together */
    // YYYYYYYY
    // YYYYYYYY
    // YYYYYYYY
    // YYYYYYYY
    // [UV-Packing]
    // YccsYccsYccs
    // YccsYccsYccs
    // UVccsUVccsUVccs
    // UVccsUVccsUVccs

    const uint32_t TileSize[2] = {128, 32}; // TileY

    GMM_RESCREATE_PARAMS gmmParams        = {};
    gmmParams.Type                        = RESOURCE_2D;
    gmmParams.NoGfxMemory                 = 1;
    gmmParams.Flags.Gpu.MMC               = 1;
    gmmParams.Flags.Gpu.Texture           = 1;
    gmmParams.Flags.Gpu.UnifiedAuxSurface = 1;
    gmmParams.Flags.Info.TiledY           = 1;
    gmmParams.BaseWidth64                 = 0x2048; //8264
    gmmParams.BaseHeight                  = 0x274;  // 628
    gmmParams.Depth                       = 0x1;
    SetTileFlag(gmmParams, static_cast<TEST_TILE_TYPE>(TEST_TILEY));
    gmmParams.Format = GMM_FORMAT_NV12;

    GMM_RESOURCE_INFO *ResourceInfo;
    //__debugbreak();
    ResourceInfo = pGmmULTClientContext->CreateResInfoObject(&gmmParams);

    uint32_t Pitch = GMM_ULT_ALIGN(gmmParams.BaseWidth64, TileSize[0]);

    uint32_t Height = GMM_ULT_ALIGN(gmmParams.BaseHeight, TileSize[1]) +
                   GMM_ULT_ALIGN(gmmParams.BaseHeight / 2, TileSize[1]);
    uint32_t Size = GMM_ULT_ALIGN(Pitch * Height, GMM_KBYTE(4));

    VerifyResourcePitch<true>(ResourceInfo, Pitch);
    VerifyResourcePitchInTiles<true>(ResourceInfo, Pitch / TileSize[0]);

    VerifyResourceSize<true>(ResourceInfo, Size);
    VerifyResourceHAlign<false>(ResourceInfo, 0); // Same as any other 2D surface -- tested elsewhere
    VerifyResourceVAlign<false>(ResourceInfo, 0); // Same as any other 2D surface -- tested elsewhere
    VerifyResourceQPitch<false>(ResourceInfo, 0); // N/A for planar

    // Y plane should be at 0,0
    EXPECT_EQ(0, ResourceInfo->GetPlanarXOffset(GMM_PLANE_Y));
    EXPECT_EQ(0, ResourceInfo->GetPlanarYOffset(GMM_PLANE_Y));

    // U/V plane should be at end of Y plane
    EXPECT_EQ(0, ResourceInfo->GetPlanarXOffset(GMM_PLANE_U));
    EXPECT_EQ(GMM_ULT_ALIGN(gmmParams.BaseHeight, TileSize[1]), ResourceInfo->GetPlanarYOffset(GMM_PLANE_U));
    EXPECT_EQ(0, ResourceInfo->GetPlanarXOffset(GMM_PLANE_V));

    EXPECT_EQ(GMM_ULT_ALIGN(gmmParams.BaseHeight, TileSize[1]), ResourceInfo->GetPlanarYOffset(GMM_PLANE_U));
    EXPECT_EQ(GMM_ULT_ALIGN(gmmParams.BaseHeight, TileSize[1]), ResourceInfo->GetPlanarYOffset(GMM_PLANE_V));

    // Y Plane CCS should be at the end of NV12 surface.
    EXPECT_EQ(Size, ResourceInfo->GetUnifiedAuxSurfaceOffset(GMM_AUX_CCS));
    EXPECT_EQ(Size, ResourceInfo->GetUnifiedAuxSurfaceOffset(GMM_AUX_Y_CCS));

    // UV Plane CCS offset
    uint32_t YCcsSize = GMM_ULT_ALIGN(((GMM_ULT_ALIGN(gmmParams.BaseHeight, TileSize[1]) * Pitch) / 1024), PAGE_SIZE);
    EXPECT_EQ(Size + YCcsSize, ResourceInfo->GetUnifiedAuxSurfaceOffset(GMM_AUX_UV_CCS));

    uint32_t UVCcsSize        = GMM_ULT_ALIGN((Height - GFX_ALIGN(gmmParams.BaseHeight, TileSize[1])) * Pitch / 1024, PAGE_SIZE);
    uint32_t MediaStateOffset = Size + YCcsSize + UVCcsSize;
    EXPECT_EQ(MediaStateOffset, ResourceInfo->GetUnifiedAuxSurfaceOffset(GMM_AUX_COMP_STATE));

    pGmmULTClientContext->DestroyResInfoObject(ResourceInfo);
}